

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

bool __thiscall
AddrManImpl::Add_(AddrManImpl *this,vector<CAddress,_std::allocator<CAddress>_> *vAddr,
                 CNetAddr *source,seconds time_penalty)

{
  string_view source_file;
  string_view logging_function;
  bool bVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  size_t in_RCX;
  long in_FS_OFFSET;
  seconds in_stack_00000068;
  Level in_stack_000000a0;
  int *in_stack_000000b0;
  unsigned_long *in_stack_000000b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000c0;
  const_iterator it;
  int *in_stack_000000d0;
  int added;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffefc;
  vector<CAddress,_std::allocator<CAddress>_> *in_stack_ffffffffffffff00;
  __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff18;
  char *flag;
  __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
  in_stack_ffffffffffffff68;
  int source_line;
  CNetAddr *in_stack_ffffffffffffff90;
  CAddress *in_stack_ffffffffffffff98;
  AddrManImpl *in_stack_ffffffffffffffa0;
  ConstevalFormatString<5U> in_stack_ffffffffffffffa8;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar5;
  CNetAddr local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = 0;
  cVar2 = std::vector<CAddress,_std::allocator<CAddress>_>::begin(in_stack_ffffffffffffff00);
  while( true ) {
    source_line = (int)((ulong)in_stack_ffffffffffffff68._M_current >> 0x20);
    cVar3 = std::vector<CAddress,_std::allocator<CAddress>_>::end(in_stack_ffffffffffffff00);
    bVar1 = __gnu_cxx::
            operator==<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                      (in_stack_ffffffffffffff08,
                       (__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
                        *)in_stack_ffffffffffffff00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
    operator*((__normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>
               *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    in_stack_ffffffffffffffb0 = in_RCX;
    bVar1 = AddSingle(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                      in_stack_00000068);
    iVar5 = (uint)bVar1 + iVar5;
    in_stack_ffffffffffffff68 =
         __gnu_cxx::
         __normal_iterator<const_CAddress_*,_std::vector<CAddress,_std::allocator<CAddress>_>_>::
         operator++(in_stack_ffffffffffffff08,(int)((ulong)in_stack_ffffffffffffff00 >> 0x20));
  }
  if ((0 < iVar5) &&
     (bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                                  Trace), bVar1)) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    flag = "Added %i addresses (of %i) from %s: %i tried, %i new\n";
    std::vector<CAddress,_std::allocator<CAddress>_>::size
              ((vector<CAddress,_std::allocator<CAddress>_> *)
               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    CNetAddr::ToStringAddr_abi_cxx11_(&local_28);
    uVar4 = 1;
    logging_function._M_str._0_4_ = in_stack_ffffffffffffffc8;
    logging_function._M_len = (size_t)cVar2._M_current;
    logging_function._M_str._4_4_ = iVar5;
    source_file._M_str = (char *)cVar3._M_current;
    source_file._M_len = in_stack_ffffffffffffffb0;
    LogPrintFormatInternal<int,unsigned_long,std::__cxx11::string,int,int>
              (logging_function,source_file,source_line,(LogFlags)flag,in_stack_000000a0,
               in_stack_ffffffffffffffa8,in_stack_000000b0,in_stack_000000b8,in_stack_000000c0,
               (int *)it._M_current,in_stack_000000d0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffefc,uVar4));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0 < iVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool AddrManImpl::Add_(const std::vector<CAddress>& vAddr, const CNetAddr& source, std::chrono::seconds time_penalty)
{
    int added{0};
    for (std::vector<CAddress>::const_iterator it = vAddr.begin(); it != vAddr.end(); it++) {
        added += AddSingle(*it, source, time_penalty) ? 1 : 0;
    }
    if (added > 0) {
        LogDebug(BCLog::ADDRMAN, "Added %i addresses (of %i) from %s: %i tried, %i new\n", added, vAddr.size(), source.ToStringAddr(), nTried, nNew);
    }
    return added > 0;
}